

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblySource.cpp
# Opt level: O0

void __thiscall
Js::WebAssemblySource::CreateSourceInfo
          (WebAssemblySource *this,bool createNewContext,ScriptContext *scriptContext)

{
  uint length;
  undefined8 this_00;
  uint uVar1;
  Cache *pCVar2;
  SRCINFO **ppSVar3;
  SourceContextInfo *ptr;
  Utf8SourceInfo *pUVar4;
  SRCINFO *pSStack_50;
  int32 cchLength;
  SRCINFO *srcInfo;
  SRCINFO si;
  ScriptContext *scriptContext_local;
  bool createNewContext_local;
  WebAssemblySource *this_local;
  
  si._32_8_ = scriptContext;
  SRCINFO::SRCINFO((SRCINFO *)&srcInfo,(SourceContextInfo *)0x0,0,0,0,0,0,0,0,0);
  pCVar2 = ScriptContext::Cache((ScriptContext *)si._32_8_);
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SRCINFO__
                      ((WriteBarrierPtr *)&pCVar2->noContextGlobalSourceInfo);
  this_00 = si._32_8_;
  pSStack_50 = *ppSVar3;
  if ((createNewContext) && ((DAT_01e9e241 & 1) != 0)) {
    uVar1 = ScriptContext::GetNextSourceContextId((ScriptContext *)si._32_8_);
    ptr = ScriptContext::CreateSourceContextInfo
                    ((ScriptContext *)this_00,(ulong)uVar1,(char16 *)0x0,0,
                     (SimpleDataCacheWrapper *)0x0,(char16 *)0x0,0);
    Memory::WriteBarrierPtr<SourceContextInfo>::operator=
              ((WriteBarrierPtr<SourceContextInfo> *)&srcInfo,ptr);
    pSStack_50 = (SRCINFO *)&srcInfo;
  }
  length = this->bufferLength >> 1;
  pUVar4 = Utf8SourceInfo::NewWithNoCopy
                     ((ScriptContext *)si._32_8_,this->buffer,length,(ulong)this->bufferLength,
                      pSStack_50,true,(Var)0x0);
  this->sourceInfo = pUVar4;
  ScriptContext::SaveSourceNoCopy((ScriptContext *)si._32_8_,this->sourceInfo,length,false);
  return;
}

Assistant:

void WebAssemblySource::CreateSourceInfo(bool createNewContext, ScriptContext* scriptContext)
{
    SRCINFO si = {
        /* sourceContextInfo   */ nullptr,
        /* dlnHost             */ 0,
        /* ulColumnHost        */ 0,
        /* lnMinHost           */ 0,
        /* ichMinHost          */ 0,
        /* ichLimHost          */ 0,
        /* ulCharOffset        */ 0,
        /* mod                 */ 0,
        /* grfsi               */ 0
    };
    SRCINFO const * srcInfo = scriptContext->Cache()->noContextGlobalSourceInfo;
    if (createNewContext && CONFIG_FLAG(WasmAssignModuleID))
    {
        // It is not legal to assign a SourceContextInfo on dynamic code, but it is usefull for debugging
        // Only do it if the specified as a test config
        si.sourceContextInfo = scriptContext->CreateSourceContextInfo(scriptContext->GetNextSourceContextId(), nullptr, 0, nullptr);
        srcInfo = &si;
    }

    // Note: We don't have real "source info" for Wasm. Following are just placeholders.
    // Hack: Wasm handles debugging differently. Fake this as "LibraryCode" so that
    // normal script debugging code ignores this source info and its functions.
    const int32 cchLength = static_cast<int32>(bufferLength / sizeof(char16));
    sourceInfo = Utf8SourceInfo::NewWithNoCopy(
        scriptContext, (LPCUTF8)buffer, cchLength, bufferLength, srcInfo, /*isLibraryCode*/true);
    scriptContext->SaveSourceNoCopy(sourceInfo, cchLength, /*isCesu8*/false);
}